

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Options::Options(Options *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Options_005fd400;
  memset(&this->_internal_metadata_,0,0xa0);
  SharedCtor(this);
  return;
}

Assistant:

Options::Options()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:bloaty.Options)
}